

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_file_time_w(archive *_a,wchar_t flag,wchar_t *pathname)

{
  wchar_t r;
  wchar_t *pathname_local;
  wchar_t flag_local;
  archive *_a_local;
  
  _a_local._4_4_ = validate_time_flag(_a,flag,"archive_match_include_file_time_w");
  if (_a_local._4_4_ == L'\0') {
    _a_local._4_4_ = set_timefilter_pathname_wcs((archive_match *)_a,flag,pathname);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_include_file_time_w(struct archive *_a, int flag,
    const wchar_t *pathname)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_file_time_w");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter_pathname_wcs((struct archive_match *)_a,
			flag, pathname);
}